

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pbVar4;
  pointer pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  undefined1 auVar7 [8];
  char **ppcVar8;
  char *pcVar9;
  bool bVar10;
  ulong uVar11;
  undefined7 extraout_var;
  long *plVar12;
  long lVar13;
  pointer pbVar14;
  long *plVar15;
  size_type *psVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  size_type sVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  string input;
  string e_2;
  string output;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  RegularExpression re;
  string local_208;
  undefined1 local_1e8 [32];
  cmCommand *local_1c8;
  pointer local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  local_198;
  pointer local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [3];
  char **local_e0 [13];
  char *local_78;
  char *local_68;
  pointer local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_180 = pbVar4 + 2;
  local_1c0 = pbVar4 + 3;
  local_58 = pbVar4 + 4;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_208.field_2;
  sVar20 = 0;
  local_1c8 = &this->super_cmCommand;
  local_178 = args;
  do {
    pbVar14 = local_1c0;
    if (pbVar4[3]._M_string_length <= sVar20) {
      cmMakefile::ClearMatches(local_1c8->Makefile);
      local_78 = (char *)0x0;
      bVar10 = cmsys::RegularExpression::compile
                         ((RegularExpression *)local_130,(local_180->_M_dataplus)._M_p);
      if (bVar10) {
        local_1e8._0_8_ =
             (local_178->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5;
        local_1e8._8_8_ =
             (local_178->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        paVar1 = &local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_208,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_1e8,paVar1->_M_local_buf);
        local_60 = pbVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                   local_1b8.field_2._M_local_buf[0]) + 1);
        }
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        pbVar4 = (pointer)(local_1e8 + 0x10);
        paVar2 = &local_170.field_2;
        lVar21 = 0;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        goto LAB_00416f1f;
      }
      std::operator+(&local_1b8,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                     local_180);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_208.field_2._M_allocated_capacity = *psVar16;
        local_208.field_2._8_8_ = plVar12[3];
        local_208._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar16;
        local_208._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_208._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                 local_1b8.field_2._M_local_buf[0]) + 1);
      }
      cmCommand::SetError(local_1c8,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      bVar17 = 0;
      goto LAB_004174d8;
    }
    uVar11 = std::__cxx11::string::find((char)local_1c0,0x5c);
    if (uVar11 == 0xffffffffffffffff) {
      sVar20 = pbVar4[3]._M_string_length;
      std::__cxx11::string::substr((ulong)&local_208,(ulong)pbVar14);
      local_130._0_4_ = 0xffffffff;
      local_128._M_p = (pointer)local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_208._M_dataplus._M_p,
                 local_208._M_dataplus._M_p + local_208._M_string_length);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::emplace_back<cmStringCommand::RegexReplacement>(&local_198,(RegexReplacement *)local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != local_118) {
        operator_delete(local_128._M_p,
                        CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                 local_118[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
LAB_00416dc1:
      bVar10 = true;
    }
    else {
      if (uVar11 != sVar20) {
        std::__cxx11::string::substr((ulong)&local_208,(ulong)local_1c0);
        local_130._0_4_ = 0xffffffff;
        local_128._M_p = (pointer)local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_208._M_dataplus._M_p,
                   local_208._M_dataplus._M_p + local_208._M_string_length);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::emplace_back<cmStringCommand::RegexReplacement>(&local_198,(RegexReplacement *)local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != local_118) {
          operator_delete(local_128._M_p,
                          CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                   local_118[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      if (uVar11 != pbVar4[3]._M_string_length - 1) {
        pcVar5 = (local_1c0->_M_dataplus)._M_p;
        cVar3 = pcVar5[uVar11 + 1];
        if ((byte)(cVar3 - 0x30U) < 10) {
          local_130._0_4_ = pcVar5[uVar11 + 1] + -0x30;
          local_120 = (char *)0x0;
          local_118[0]._M_local_buf[0] = '\0';
          local_128._M_p = (pointer)local_118;
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_198,(RegexReplacement *)local_130);
        }
        else if (cVar3 == '\\') {
          local_130._0_4_ = 0xffffffff;
          local_128._M_p = (pointer)local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"\\","");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_198,(RegexReplacement *)local_130);
        }
        else {
          if (cVar3 != 'n') {
            local_130 = (undefined1  [8])&local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_130,"sub-command REGEX, mode REPLACE: Unknown escape \"","");
            std::__cxx11::string::substr((ulong)&local_208,(ulong)local_1c0);
            std::__cxx11::string::_M_append((char *)local_130,(ulong)local_208._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar1) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_130);
            cmCommand::SetError(local_1c8,(string *)local_130);
            goto LAB_00416c0a;
          }
          local_130._0_4_ = 0xffffffff;
          local_128._M_p = (pointer)local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"\n","");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_198,(RegexReplacement *)local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != local_118) {
          operator_delete(local_128._M_p,
                          CONCAT71(local_118[0]._M_allocated_capacity._1_7_,
                                   local_118[0]._M_local_buf[0]) + 1);
        }
        sVar20 = uVar11 + 2;
        goto LAB_00416dc1;
      }
      local_130 = (undefined1  [8])&local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,
                 "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.","");
      cmCommand::SetError(local_1c8,(string *)local_130);
LAB_00416c0a:
      if (local_130 != (undefined1  [8])&local_120) {
        operator_delete((void *)local_130,(ulong)(local_120 + 1));
      }
      bVar10 = false;
    }
  } while (bVar10);
  bVar17 = 0;
  goto LAB_004174ea;
LAB_00416f1f:
  do {
    bVar10 = cmsys::RegularExpression::find
                       ((RegularExpression *)local_130,local_208._M_dataplus._M_p + lVar21);
    local_178 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(local_178._4_4_,(int)CONCAT71(extraout_var,bVar10));
    if (!bVar10) {
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)&local_208);
      std::__cxx11::string::_M_append((char *)&local_1b8,local_1e8._0_8_);
      if ((pointer)local_1e8._0_8_ != pbVar4) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
      cmMakefile::AddDefinition(local_1c8->Makefile,local_58,local_1b8._M_dataplus._M_p);
      break;
    }
    cmMakefile::ClearMatches(local_1c8->Makefile);
    cmMakefile::StoreMatches(local_1c8->Makefile,(RegularExpression *)local_130);
    pcVar9 = local_68;
    ppcVar8 = local_e0[0];
    auVar7 = local_130;
    std::__cxx11::string::substr((ulong)local_1e8,(ulong)&local_208);
    std::__cxx11::string::_M_append((char *)&local_1b8,local_1e8._0_8_);
    if ((pointer)local_1e8._0_8_ != pbVar4) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    if ((undefined1  [8])ppcVar8 == auVar7) {
      std::operator+(&local_170,"sub-command REGEX, mode REPLACE regex \"",local_180);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_170);
      pbVar14 = (pointer)(plVar12 + 2);
      if ((pointer)*plVar12 == pbVar14) {
        local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
        local_1e8._24_8_ = plVar12[3];
        local_1e8._0_8_ = pbVar4;
      }
      else {
        local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
        local_1e8._0_8_ = (pointer)*plVar12;
      }
      local_1e8._8_8_ = plVar12[1];
      *plVar12 = (long)pbVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(local_1c8,(string *)local_1e8);
      if ((pointer)local_1e8._0_8_ != pbVar4) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
      bVar10 = false;
    }
    else {
      lVar18 = (long)ppcVar8 - (long)pcVar9;
      bVar10 = local_198.
               super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               local_198.
               super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar10) {
        uVar11 = 0;
        uVar19 = 1;
        do {
          lVar13 = (long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].number;
          if (lVar13 < 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_1b8,
                       (ulong)local_198.
                              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].value._M_dataplus.
                              _M_p);
          }
          else {
            if ((((*(long *)(local_130 + lVar13 * 8) - (long)local_68 == 0xffffffffffffffff) ||
                 ((long)local_e0[lVar13] - (long)local_68 == 0xffffffffffffffff)) ||
                (local_208._M_string_length - lVar21 <
                 (ulong)(*(long *)(local_130 + lVar13 * 8) - (long)local_68))) ||
               (local_208._M_string_length - lVar21 <
                (ulong)((long)local_e0[lVar13] - (long)local_68))) {
              std::operator+(&local_50,"sub-command REGEX, mode REPLACE: replace expression \"",
                             local_1c0);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_150 = &local_140;
              plVar15 = plVar12 + 2;
              if ((long *)*plVar12 == plVar15) {
                local_140 = *plVar15;
                lStack_138 = plVar12[3];
              }
              else {
                local_140 = *plVar15;
                local_150 = (long *)*plVar12;
              }
              local_148 = plVar12[1];
              *plVar12 = (long)plVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_150,(ulong)local_60[2]._M_dataplus._M_p);
              psVar16 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_170.field_2._M_allocated_capacity = *psVar16;
                local_170.field_2._8_8_ = plVar12[3];
                local_170._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_170.field_2._M_allocated_capacity = *psVar16;
                local_170._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_170._M_string_length = plVar12[1];
              *plVar12 = (long)psVar16;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_170);
              pbVar14 = (pointer)(plVar12 + 2);
              if ((pointer)*plVar12 == pbVar14) {
                local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
                local_1e8._24_8_ = plVar12[3];
                local_1e8._0_8_ = pbVar4;
              }
              else {
                local_1e8._16_8_ = (pbVar14->_M_dataplus)._M_p;
                local_1e8._0_8_ = (pointer)*plVar12;
              }
              local_1e8._8_8_ = plVar12[1];
              *plVar12 = (long)pbVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != paVar2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              cmCommand::SetError(local_1c8,(string *)local_1e8);
              if ((pointer)local_1e8._0_8_ != pbVar4) {
                operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              }
              lVar18 = 0;
              break;
            }
            std::__cxx11::string::substr((ulong)local_1e8,(ulong)&local_208);
            std::__cxx11::string::_M_append((char *)&local_1b8,local_1e8._0_8_);
            if ((pointer)local_1e8._0_8_ != pbVar4) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            }
          }
          uVar11 = ((long)local_198.
                          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_198.
                          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar22 = uVar11 < uVar19;
          bVar23 = uVar11 - uVar19 == 0;
          bVar10 = bVar22 || bVar23;
          uVar11 = uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (!bVar22 && !bVar23);
      }
      lVar21 = lVar21 + lVar18;
    }
  } while (bVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  pvVar6 = local_178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  bVar17 = (byte)pvVar6 ^ 1;
LAB_004174d8:
  if (local_78 != (char *)0x0) {
    operator_delete__(local_78);
  }
LAB_004174ea:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector(&local_198);
  return (bool)bVar17;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while (l < replace.length()) {
    std::string::size_type r = replace.find('\\', l);
    if (r == std::string::npos) {
      r = replace.length();
      replacement.push_back(replace.substr(l, r - l));
    } else {
      if (r - l > 0) {
        replacement.push_back(replace.substr(l, r - l));
      }
      if (r == (replace.length() - 1)) {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
      }
      if ((replace[r + 1] >= '0') && (replace[r + 1] <= '9')) {
        replacement.push_back(replace[r + 1] - '0');
      } else if (replace[r + 1] == 'n') {
        replacement.push_back("\n");
      } else if (replace[r + 1] == '\\') {
        replacement.push_back("\\");
      } else {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
      }
      r += 2;
    }
    l = r;
  }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while (re.find(input.c_str() + base)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::string e = "sub-command REGEX, mode REPLACE regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }

    // Concatenate the replacement for the match.
    for (unsigned int i = 0; i < replacement.size(); ++i) {
      if (replacement[i].number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
      } else {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \"" +
            replace + "\" contains an out-of-range escape for regex \"" +
            regex + "\".";
          this->SetError(e);
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}